

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.hpp
# Opt level: O3

void __thiscall
peach::expression::AssignExpression::AssignExpression
          (AssignExpression *this,ExprShPtr *left,ExprShPtr *right,FunctionType *functor)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  LvalueExpression *__tmp;
  element_type *peVar4;
  invalid_argument *this_00;
  code *pcVar5;
  pointer_____offset_0x10___ *ppuVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  
  (this->super_SingleIndentationLevelExpression).super_Expression._vptr_Expression =
       (_func_int **)&PTR_eval_00131a08;
  (this->left_).super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->left_).super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->right_).super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->right_).super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&(this->functor_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->functor_).super__Function_base._M_functor + 8) = 0;
  (this->functor_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->functor_)._M_invoker = functor->_M_invoker;
  if ((functor->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(functor->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->functor_).super__Function_base._M_functor =
         *(undefined8 *)&(functor->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->functor_).super__Function_base._M_functor + 8) = uVar3;
    (this->functor_).super__Function_base._M_manager = (functor->super__Function_base)._M_manager;
    (functor->super__Function_base)._M_manager = (_Manager_type)0x0;
    functor->_M_invoker = (_Invoker_type)0x0;
  }
  peVar1 = (left->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     ((right->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"nullptr expression in AssignExpression constructor");
    pcVar5 = std::invalid_argument::~invalid_argument;
    ppuVar6 = (pointer_____offset_0x10___ *)&std::invalid_argument::typeinfo;
  }
  else {
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar4 = (element_type *)
             __dynamic_cast(peVar1,&Expression::typeinfo,&LvalueExpression::typeinfo,0);
    if (peVar4 != (element_type *)0x0) {
      p_Var7 = (left->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
      if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    (this->left_).
    super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar4;
    p_Var2 = (this->left_).
             super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->left_).
    super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var7;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      peVar4 = (this->left_).
               super___shared_ptr<peach::expression::LvalueExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    if (peVar4 != (element_type *)0x0) {
      peVar1 = (right->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var2 = (right->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (right->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = (element_type *)0x0;
      (right->super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var7 = (this->right_).
               super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->right_).super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      (this->right_).super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        return;
      }
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x38);
    exception::InvalidAssignationError::InvalidAssignationError
              ((InvalidAssignationError *)this_00,0,0);
    pcVar5 = exception::PeachException::~PeachException;
    ppuVar6 = &exception::InvalidAssignationError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar6,pcVar5);
}

Assistant:

AssignExpression(
        ExprShPtr left,
        ExprShPtr right,
        FunctionType functor)
        : functor_(std::move(functor))
    {
        if (!left || !right)
        {
            throw std::invalid_argument("nullptr expression in AssignExpression constructor");
        }
        left_ = std::dynamic_pointer_cast<LvalueExpression>(left);
        if (!left_)
        {
            exception::throwFromCoords<exception::InvalidAssignationError>(0, 0); // TODO: expression must know its position
        }
        right_ = std::move(right);
    }